

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O2

void __thiscall
Qentem::QTest::IsEqual<Qentem::StringStream<char>,char[3]>
          (QTest *this,StringStream<char> *left,char (*right) [3],unsigned_long line)

{
  bool bVar1;
  
  if ((this->error_ != true) || (this->continue_on_error_ == true)) {
    bVar1 = StringStream<char>::operator!=(left,*right);
    if (bVar1) {
      this->error_ = true;
      PrintErrorMessage<Qentem::StringStream<char>,char[3]>(this,false,left,right,line);
      return;
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void IsEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left != right)) {
            error_ = true;
            QTest::PrintErrorMessage(false, left, right, line);
        }
    }